

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

void __thiscall QGraphicsViewPrivate::~QGraphicsViewPrivate(QGraphicsViewPrivate *this)

{
  *(undefined ***)&(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate
       = &PTR__QGraphicsViewPrivate_007ee690;
  QRegion::~QRegion(&this->exposedRegion);
  QRegion::~QRegion(&this->dirtyRegion);
  QCursor::~QCursor(&this->originalCursor);
  QRegion::~QRegion(&this->backgroundPixmapExposed);
  QPixmap::~QPixmap(&this->backgroundPixmap);
  QBrush::~QBrush(&this->foregroundBrush);
  QBrush::~QBrush(&this->backgroundBrush);
  QArrayDataPointer<QStyleOptionGraphicsItem>::~QArrayDataPointer(&(this->styleOptions).d);
  QWeakPointer<QObject>::~QWeakPointer(&(this->scene).wp);
  QEventStorage<QMouseEvent>::~QEventStorage(&this->lastMouseEvent);
  QAbstractScrollAreaPrivate::~QAbstractScrollAreaPrivate(&this->super_QAbstractScrollAreaPrivate);
  return;
}

Assistant:

QGraphicsViewPrivate::~QGraphicsViewPrivate()
{
}